

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::keyPressEvent(QGraphicsScene *this,QKeyEvent *keyEvent)

{
  bool bVar1;
  QGraphicsScenePrivate *this_00;
  QGraphicsItem **ppQVar2;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  sockaddr *__addr;
  QGraphicsItem *in_RSI;
  QGraphicsItem *in_RDI;
  QGraphicsItem *p;
  QGraphicsItem *item;
  QGraphicsScenePrivate *d;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffffb8;
  QGraphicsItem *local_38;
  QGraphicsItem *item_00;
  QGraphicsItem *this_01;
  QGraphicsItem *this_02;
  
  this_01 = in_RSI;
  this_02 = in_RDI;
  this_00 = d_func((QGraphicsScene *)0x9d2961);
  bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9d2977);
  if (bVar1) {
    local_38 = (QGraphicsItem *)0x0;
    __addr = extraout_RDX;
  }
  else {
    ppQVar2 = QList<QGraphicsItem_*>::constLast(in_stack_ffffffffffffffb8);
    local_38 = *ppQVar2;
    __addr = extraout_RDX_00;
  }
  if (local_38 == (QGraphicsItem *)0x0) {
    local_38 = focusItem((QGraphicsScene *)in_RDI);
    __addr = extraout_RDX_01;
  }
  item_00 = local_38;
  if (local_38 == (QGraphicsItem *)0x0) {
    QEvent::ignore((QEvent *)this_01);
  }
  else {
    do {
      QEvent::accept((QEvent *)this_01,(int)in_RSI,__addr,
                     (socklen_t *)CONCAT71(in_register_00000009,in_CL));
      in_RSI = local_38;
      bVar1 = QGraphicsItem::isBlockedByModalPanel(this_02,(QGraphicsItem **)this_01);
      if (bVar1) {
        return;
      }
      local_38 = in_RSI;
      bVar1 = QGraphicsScenePrivate::sendEvent(this_00,item_00,(QEvent *)in_RSI);
      if (!bVar1) {
        return;
      }
      in_CL = QEvent::isAccepted((QEvent *)this_01);
      bVar1 = false;
      __addr = extraout_RDX_02;
      if (!(bool)in_CL) {
        in_CL = QGraphicsItem::isPanel((QGraphicsItem *)0x9d2a33);
        bVar1 = false;
        __addr = extraout_RDX_03;
        if (!(bool)in_CL) {
          local_38 = QGraphicsItem::parentItem((QGraphicsItem *)0x9d2a4a);
          bVar1 = local_38 != (QGraphicsItem *)0x0;
          __addr = extraout_RDX_04;
        }
      }
    } while (bVar1);
  }
  return;
}

Assistant:

void QGraphicsScene::keyPressEvent(QKeyEvent *keyEvent)
{
    // ### Merge this function with keyReleaseEvent; they are identical
    // ### (except this comment).
    Q_D(QGraphicsScene);
    QGraphicsItem *item = !d->keyboardGrabberItems.isEmpty() ? d->keyboardGrabberItems.constLast() : 0;
    if (!item)
        item = focusItem();
    if (item) {
        QGraphicsItem *p = item;
        do {
            // Accept the event by default
            keyEvent->accept();
            // Send it; QGraphicsItem::keyPressEvent ignores it.  If the event
            // is filtered out, stop propagating it.
            if (p->isBlockedByModalPanel())
                break;
            if (!d->sendEvent(p, keyEvent))
                break;
        } while (!keyEvent->isAccepted() && !p->isPanel() && (p = p->parentItem()));
    } else {
        keyEvent->ignore();
    }
}